

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *pcVar2;
  size_type sVar3;
  pointer pcVar4;
  pointer pbVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  undefined7 extraout_var;
  string *psVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  LinkClosure *pLVar13;
  cmValue cVar14;
  byte bVar15;
  byte bVar16;
  pointer pbVar17;
  string *config;
  undefined4 uVar18;
  cmComputeLinkInformation *pcVar19;
  bool bVar20;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar21;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  string install_rpath;
  string d;
  string rootPath;
  string useVar;
  string targetOutputDir;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string local_208;
  char *local_1e8;
  undefined8 local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  undefined8 local_1c8;
  cmComputeLinkInformation *local_1c0;
  string *local_1b8;
  undefined4 local_1ac;
  string local_1a8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_188;
  string *local_180;
  string local_178;
  string *local_158;
  string *local_150;
  string *local_148;
  string local_140;
  string *local_108;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  pcVar1 = this->Makefile;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_1c0 = this;
  local_188 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)runtimeDirs;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"CMAKE_SKIP_RPATH","");
  bVar6 = cmMakefile::IsOn(pcVar1,&local_208);
  bVar20 = (local_1c0->RuntimeFlag)._M_string_length == 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  bVar7 = true;
  if (!for_install) {
    pcVar2 = local_1c0->Target;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"BUILD_WITH_INSTALL_RPATH","");
    bVar7 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_80);
  }
  pcVar19 = local_1c0;
  if ((!for_install) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2)) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (bVar6 || bVar20) {
    bVar16 = 0;
    bVar15 = 0;
  }
  else {
    bVar8 = cmGeneratorTarget::HaveInstallTreeRPATH(pcVar19->Target,&pcVar19->Config);
    bVar16 = bVar8 & bVar7;
    bVar8 = cmGeneratorTarget::HaveBuildTreeRPATH(local_1c0->Target,&local_1c0->Config);
    bVar15 = (bVar7 ^ 1U) & bVar8;
  }
  if ((bVar6 || bVar20) || (bVar7 ^ 1U) != 0) {
LAB_004edb5e:
    bVar8 = false;
    uVar18 = 0;
  }
  else {
    pcVar1 = local_1c0->Makefile;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"CMAKE_SKIP_INSTALL_RPATH","");
    bVar8 = cmMakefile::IsOn(pcVar1,&local_a0);
    if (bVar8) goto LAB_004edb5e;
    pcVar2 = local_1c0->Target;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"INSTALL_RPATH_USE_LINK_PATH","");
    bVar9 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_c0);
    bVar8 = true;
    uVar18 = (undefined4)CONCAT71(extraout_var,bVar9);
  }
  if ((bVar8) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2)) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (((!bVar6 && !bVar20) && (bVar7 ^ 1U) == 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2)) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = local_1c0->Makefile;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,"CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN","");
  psVar11 = cmMakefile::GetSafeDefinition(pcVar1,&local_208);
  local_1ac = uVar18;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  pcVar19 = local_1c0;
  config = &local_1c0->Config;
  cmGeneratorTarget::GetDirectory(&local_e0,local_1c0->Target,config,RuntimeBinaryArtifact);
  pcVar2 = pcVar19->Target;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"BUILD_RPATH_USE_ORIGIN","");
  bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_208);
  sVar3 = psVar11->_M_string_length;
  local_1b8 = (string *)CONCAT71(local_1b8._1_7_,local_e0._M_string_length != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  pcVar19 = local_1c0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (bVar16 != 0) {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208._M_string_length = 0;
    local_208.field_2._M_allocated_capacity =
         local_208.field_2._M_allocated_capacity & 0xffffffffffffff00;
    cmGeneratorTarget::GetInstallRPATH(local_1c0->Target,config,&local_208);
    cmCLI_ExpandListUnique
              (&local_208,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_188,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar15 == 0) {
    if ((char)local_1ac == '\0') goto LAB_004ee5b1;
  }
  else {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208._M_string_length = 0;
    local_208.field_2._M_allocated_capacity =
         local_208.field_2._M_allocated_capacity & 0xffffffffffffff00;
    bVar20 = cmGeneratorTarget::GetBuildRPATH(pcVar19->Target,config,&local_208);
    if (bVar20) {
      cmCLI_ExpandListUnique
                (&local_208,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_188,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (bVar15 == 0 && (char)local_1ac == '\0') goto LAB_004ee5b1;
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  pcVar1 = pcVar19->Makefile;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"CMAKE_SYSROOT_LINK","");
  cVar14 = cmMakefile::GetDefinition(pcVar1,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (cVar14.Value == (string *)0x0) {
    pcVar1 = pcVar19->Makefile;
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"CMAKE_SYSROOT","");
    cmMakefile::GetSafeDefinition(pcVar1,&local_208);
    std::__cxx11::string::_M_assign((string *)&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_178);
  }
  pcVar1 = pcVar19->Makefile;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"CMAKE_STAGING_PREFIX","");
  local_180 = (string *)cmMakefile::GetDefinition(pcVar1,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = pcVar19->Makefile;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"CMAKE_INSTALL_PREFIX","");
  local_150 = cmMakefile::GetSafeDefinition(pcVar1,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::ConvertToUnixSlashes(&local_178);
  pvVar12 = cmOrderDirectories::GetOrderedDirectories_abi_cxx11_
                      ((pcVar19->OrderRuntimeSearchPath)._M_t.
                       super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                       .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl);
  local_148 = psVar11;
  local_108 = config;
  local_158 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar19->CMakeInstance);
  uVar18 = local_1ac;
  pbVar17 = (pvVar12->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (pvVar12->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar17 != pbVar5) {
    bVar16 = bVar6 & (byte)local_1b8;
    local_1b8 = local_180;
    if (local_180 == (string *)0x0) {
      local_1b8 = &cmValue::Empty_abi_cxx11_;
    }
    do {
      if (bVar15 == 0) {
        if ((char)uVar18 != '\0') {
          psVar11 = cmake::GetHomeDirectory_abi_cxx11_(local_1c0->CMakeInstance);
          bVar6 = cmsys::SystemTools::ComparePath(pbVar17,psVar11);
          if ((((!bVar6) && (bVar6 = cmsys::SystemTools::ComparePath(pbVar17,local_158), !bVar6)) &&
              (bVar6 = cmsys::SystemTools::IsSubDirectory(pbVar17,psVar11), !bVar6)) &&
             (bVar6 = cmsys::SystemTools::IsSubDirectory(pbVar17,local_158), !bVar6)) {
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            pcVar4 = (pbVar17->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a8,pcVar4,pcVar4 + pbVar17->_M_string_length);
            if (local_178._M_string_length == 0) {
LAB_004ee2b5:
              if ((local_180 != (string *)0x0) && (local_180->_M_string_length != 0)) {
                local_208._M_dataplus._M_p = (pointer)local_1a8._M_string_length;
                local_208._M_string_length = (size_type)local_1a8._M_dataplus._M_p;
                __str_02._M_str = (local_1b8->_M_dataplus)._M_p;
                __str_02._M_len = local_1b8->_M_string_length;
                iVar10 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                   ((basic_string_view<char,_std::char_traits<char>_> *)&local_208,0
                                    ,local_1b8->_M_string_length,__str_02);
                if (iVar10 == 0) {
                  std::__cxx11::string::erase((ulong)&local_1a8,0);
                  local_208._M_string_length = (size_type)(local_150->_M_dataplus)._M_p;
                  local_208._M_dataplus._M_p = (pointer)local_150->_M_string_length;
                  local_208.field_2._M_allocated_capacity = 0;
                  local_140._M_dataplus._M_p = (pointer)0x0;
                  local_140._M_string_length = 1;
                  local_1e8 = (char *)((long)&local_140.field_2 + 8);
                  local_140.field_2._M_local_buf[8] = '/';
                  local_208.field_2._8_8_ = 1;
                  local_1e0 = 0;
                  local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1a8._M_string_length;
                  local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1a8._M_dataplus._M_p;
                  local_1c8 = 0;
                  views_00._M_len = 3;
                  views_00._M_array = (iterator)&local_208;
                  local_140.field_2._M_allocated_capacity = (size_type)local_1e8;
                  cmCatViews(&local_100,views_00);
                  std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_100);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_100._M_dataplus._M_p != &local_100.field_2) {
                    operator_delete(local_100._M_dataplus._M_p,
                                    local_100.field_2._M_allocated_capacity + 1);
                  }
                  cmsys::SystemTools::ConvertToUnixSlashes(&local_1a8);
                }
              }
            }
            else {
              local_208._M_dataplus._M_p = (pointer)local_1a8._M_string_length;
              local_208._M_string_length = (size_type)local_1a8._M_dataplus._M_p;
              __str_01._M_str = local_178._M_dataplus._M_p;
              __str_01._M_len = local_178._M_string_length;
              iVar10 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&local_208,0,
                                  local_178._M_string_length,__str_01);
              if (iVar10 != 0) goto LAB_004ee2b5;
              std::__cxx11::string::erase((ulong)&local_1a8,0);
            }
            pVar21 = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)&local_60,&local_1a8);
            if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_188,&local_1a8);
            }
            goto LAB_004ee515;
          }
        }
      }
      else {
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        pcVar4 = (pbVar17->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,pcVar4,pcVar4 + pbVar17->_M_string_length);
        if (local_178._M_string_length == 0) {
LAB_004ee06c:
          if ((local_180 != (string *)0x0) && (local_180->_M_string_length != 0)) {
            local_208._M_dataplus._M_p = (pointer)local_1a8._M_string_length;
            local_208._M_string_length = (size_type)local_1a8._M_dataplus._M_p;
            __str_00._M_str = (local_1b8->_M_dataplus)._M_p;
            __str_00._M_len = local_1b8->_M_string_length;
            iVar10 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                               ((basic_string_view<char,_std::char_traits<char>_> *)&local_208,0,
                                local_1b8->_M_string_length,__str_00);
            if (iVar10 == 0) {
              std::__cxx11::string::erase((ulong)&local_1a8,0);
              local_208._M_string_length = (size_type)(local_150->_M_dataplus)._M_p;
              local_208._M_dataplus._M_p = (pointer)local_150->_M_string_length;
              local_208.field_2._M_allocated_capacity = 0;
              local_140._M_dataplus._M_p = (pointer)0x0;
              local_140._M_string_length = 1;
              local_1e8 = (char *)((long)&local_140.field_2 + 8);
              local_140.field_2._M_local_buf[8] = '/';
              local_208.field_2._8_8_ = 1;
              local_1e0 = 0;
              local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1a8._M_string_length;
              local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1a8._M_dataplus._M_p;
              local_1c8 = 0;
              views_01._M_len = 3;
              views_01._M_array = (iterator)&local_208;
              local_140.field_2._M_allocated_capacity = (size_type)local_1e8;
              cmCatViews(&local_100,views_01);
              std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_100);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity + 1);
              }
              cmsys::SystemTools::ConvertToUnixSlashes(&local_1a8);
              goto LAB_004ee4f0;
            }
          }
          if (((bVar16 & sVar3 != 0) != 0) &&
             ((bVar6 = cmsys::SystemTools::ComparePath(&local_1a8,local_158), bVar6 ||
              (bVar6 = cmsys::SystemTools::IsSubDirectory(&local_1a8,local_158), bVar6)))) {
            cmSystemTools::RelativePath(&local_208,&local_e0,&local_1a8);
            std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_208);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_string_length ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::__cxx11::string::_M_assign((string *)&local_1a8);
            }
            else {
              local_208._M_string_length = (size_type)(local_148->_M_dataplus)._M_p;
              local_208._M_dataplus._M_p = (pointer)local_148->_M_string_length;
              local_208.field_2._M_allocated_capacity = 0;
              local_208.field_2._8_8_ = 1;
              local_1e8 = "/";
              local_1e0 = 0;
              local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1a8._M_string_length;
              local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1a8._M_dataplus._M_p;
              local_1c8 = 0;
              views._M_len = 3;
              views._M_array = (iterator)&local_208;
              cmCatViews(&local_140,views);
              std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_140);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p,
                                (ulong)(local_140.field_2._M_allocated_capacity + 1));
              }
            }
          }
        }
        else {
          local_208._M_dataplus._M_p = (pointer)local_1a8._M_string_length;
          local_208._M_string_length = (size_type)local_1a8._M_dataplus._M_p;
          __str._M_str = local_178._M_dataplus._M_p;
          __str._M_len = local_178._M_string_length;
          iVar10 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                             ((basic_string_view<char,_std::char_traits<char>_> *)&local_208,0,
                              local_178._M_string_length,__str);
          if (iVar10 != 0) goto LAB_004ee06c;
          std::__cxx11::string::erase((ulong)&local_1a8,0);
        }
LAB_004ee4f0:
        pVar21 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&local_60,&local_1a8);
        if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_188,&local_1a8);
        }
LAB_004ee515:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
      }
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 != pbVar5);
  }
  config = local_108;
  pcVar19 = local_1c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
    config = local_108;
    pcVar19 = local_1c0;
  }
LAB_004ee5b1:
  pLVar13 = cmGeneratorTarget::GetLinkClosure(pcVar19->Target,config);
  pbVar17 = (pLVar13->Languages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (pLVar13->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar17 != pbVar5) {
    do {
      local_208._M_dataplus._M_p = (pointer)0x6;
      local_208._M_string_length = 0x8b9254;
      local_208.field_2._M_allocated_capacity = 0;
      local_1e8 = (pbVar17->_M_dataplus)._M_p;
      local_208.field_2._8_8_ = pbVar17->_M_string_length;
      local_1e0 = 0;
      local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x2e;
      local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x8e6162;
      local_1c8 = 0;
      views_02._M_len = 3;
      views_02._M_array = (iterator)&local_208;
      cmCatViews(&local_140,views_02);
      bVar6 = cmMakefile::IsOn(local_1c0->Makefile,&local_140);
      if (bVar6) {
        local_208._M_dataplus._M_p = (pointer)0x6;
        local_208._M_string_length = 0x8b9254;
        local_208.field_2._M_allocated_capacity = 0;
        local_1e8 = (pbVar17->_M_dataplus)._M_p;
        local_208.field_2._8_8_ = pbVar17->_M_string_length;
        local_1e0 = 0;
        local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1a;
        local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x8e60b3;
        local_1c8 = 0;
        views_03._M_len = 3;
        views_03._M_array = (iterator)&local_208;
        cmCatViews(&local_178,views_03);
        cVar14 = cmMakefile::GetDefinition(local_1c0->Makefile,&local_178);
        if (cVar14.Value != (string *)0x0) {
          cmCLI_ExpandListUnique
                    (cVar14.Value,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_188,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_60);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,
                          CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                   local_178.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,
                        (ulong)(local_140.field_2._M_allocated_capacity + 1));
      }
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 != pbVar5);
  }
  cmCLI_ExpandListUnique
            (&local_1c0->RuntimeAlways,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_188,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install) const
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH(this->Config) &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Select whether to use $ORIGIN in RPATHs for artifacts in the build tree.
  std::string const& originToken = this->Makefile->GetSafeDefinition(
    "CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN");
  std::string targetOutputDir = this->Target->GetDirectory(this->Config);
  bool use_relative_build_rpath =
    this->Target->GetPropertyAsBool("BUILD_RPATH_USE_ORIGIN") &&
    !originToken.empty() && !targetOutputDir.empty();

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    std::string install_rpath;
    this->Target->GetInstallRPATH(this->Config, install_rpath);
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    std::string build_rpath;
    if (this->Target->GetBuildRPATH(this->Config, build_rpath)) {
      // This will not resolve entries to use $ORIGIN, the user is expected
      // to do that if necessary.
      cmCLI_ExpandListUnique(build_rpath, runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (cmValue sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = *sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    cmValue stagePath = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    std::string const& installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    std::string const& topBinaryDir =
      this->CMakeInstance->GetHomeOutputDirectory();
    for (std::string const& ri : rdirs) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = ri;
        if (!rootPath.empty() && cmHasPrefix(d, rootPath)) {
          d.erase(0, rootPath.size());
        } else if (cmNonempty(stagePath) && cmHasPrefix(d, *stagePath)) {
          d.erase(0, (*stagePath).size());
          d = cmStrCat(installPrefix, '/', d);
          cmSystemTools::ConvertToUnixSlashes(d);
        } else if (use_relative_build_rpath) {
          // If expansion of the $ORIGIN token is supported and permitted per
          // policy, use relative paths in the RPATH.
          if (cmSystemTools::ComparePath(d, topBinaryDir) ||
              cmSystemTools::IsSubDirectory(d, topBinaryDir)) {
            d = cmSystemTools::RelativePath(targetOutputDir, d);
            if (!d.empty()) {
              d = cmStrCat(originToken, "/", d);
            } else {
              d = originToken;
            }
          }
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(std::move(d));
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        std::string const& topSourceDir =
          this->CMakeInstance->GetHomeDirectory();
        if (!cmSystemTools::ComparePath(ri, topSourceDir) &&
            !cmSystemTools::ComparePath(ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(ri, topBinaryDir)) {
          std::string d = ri;
          if (!rootPath.empty() && cmHasPrefix(d, rootPath)) {
            d.erase(0, rootPath.size());
          } else if (cmNonempty(stagePath) && cmHasPrefix(d, *stagePath)) {
            d.erase(0, (*stagePath).size());
            d = cmStrCat(installPrefix, '/', d);
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(std::move(d));
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::string const& li : lc->Languages) {
      std::string useVar = cmStrCat(
        "CMAKE_", li, "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH");
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar =
          cmStrCat("CMAKE_", li, "_IMPLICIT_LINK_DIRECTORIES");
        if (cmValue dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(*dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways, runtimeDirs, emitted);
}